

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsSamplerObjectTest.cpp
# Opt level: O2

void __thiscall
deqp::gls::MultiTextureSamplerTest::renderResults
          (MultiTextureSamplerTest *this,Surface *textureResult,Surface *samplerResult,int x,int y)

{
  SamplingState *pSVar1;
  RenderContext *pRVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  SamplingState state;
  SamplingState state_00;
  SamplingState state_01;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  GLuint GVar22;
  GLuint GVar23;
  int y_00;
  int iVar24;
  GLenum GVar25;
  undefined4 extraout_var;
  TestError *this_00;
  GLuint sampler;
  GLuint local_c0;
  GLuint local_bc;
  int local_b8;
  int local_b4;
  GLuint texture2;
  GLuint texture1;
  Surface *local_a8;
  Surface *local_a0;
  undefined8 uStack_98;
  undefined4 uStack_90;
  undefined4 local_8c;
  undefined4 uStack_88;
  undefined8 uStack_84;
  undefined8 uStack_78;
  undefined4 uStack_70;
  undefined4 local_6c;
  undefined4 uStack_68;
  undefined8 uStack_64;
  PixelBufferAccess local_58;
  Functions *gl;
  
  local_a8 = samplerResult;
  local_a0 = textureResult;
  iVar24 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar24);
  local_c0 = createTexture(gl,this->m_target,0);
  texture1 = local_c0;
  local_bc = createTexture(gl,this->m_target,1);
  sampler = 0xffffffff;
  local_b8 = x;
  local_b4 = y;
  texture2 = local_bc;
  (*gl->viewport)(x,y,0x80,0x80);
  GVar25 = (*gl->getError)();
  glu::checkError(GVar25,"glViewport(x, y, VIEWPORT_WIDTH, VIEWPORT_HEIGHT)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x438);
  (*gl->genSamplers)(1,&sampler);
  GVar25 = (*gl->getError)();
  glu::checkError(GVar25,"glGenSamplers(1, &sampler)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x43b);
  if (sampler != 0xffffffff) {
    (*gl->bindSampler)(0,sampler);
    GVar25 = (*gl->getError)();
    glu::checkError(GVar25,"glBindSampler(0, sampler)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                    ,0x43f);
    (*gl->bindSampler)(1,sampler);
    GVar25 = (*gl->getError)();
    glu::checkError(GVar25,"glBindSampler(1, sampler)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                    ,0x441);
    pSVar1 = &this->m_samplerState;
    uStack_78._0_4_ = pSVar1->minFilter;
    uStack_78._4_4_ = pSVar1->magFilter;
    uVar3 = (this->m_samplerState).wrapT;
    uVar4 = (this->m_samplerState).wrapS;
    uVar16 = pSVar1->minFilter;
    uVar17 = pSVar1->magFilter;
    uVar18 = pSVar1->wrapT;
    state.wrapT = uVar18;
    state.magFilter = uVar17;
    state.minFilter = uVar16;
    uVar5 = (this->m_samplerState).wrapR;
    uStack_64._0_4_ = (this->m_samplerState).minLod;
    uStack_64._4_4_ = (this->m_samplerState).maxLod;
    state.wrapS = uVar4;
    state.wrapR = uVar5;
    state.minLod = (GLfloat)(undefined4)uStack_64;
    state.maxLod = (GLfloat)uStack_64._4_4_;
    uStack_70 = uVar3;
    local_6c = uVar4;
    uStack_68 = uVar5;
    setSamplerState(gl,state,sampler);
    GVar22 = local_c0;
    (*gl->bindTexture)(this->m_target,local_c0);
    GVar25 = (*gl->getError)();
    glu::checkError(GVar25,"glBindTexture(m_target, texture1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                    ,0x448);
    uVar6 = (this->m_textureState1).wrapR;
    uStack_84._0_4_ = (this->m_textureState1).minLod;
    uStack_84._4_4_ = (this->m_textureState1).maxLod;
    pSVar1 = &this->m_textureState1;
    uStack_98._0_4_ = pSVar1->minFilter;
    uStack_98._4_4_ = pSVar1->magFilter;
    uVar7 = (this->m_textureState1).wrapT;
    uVar8 = (this->m_textureState1).wrapS;
    uVar19 = pSVar1->minFilter;
    uVar20 = pSVar1->magFilter;
    uVar21 = pSVar1->wrapT;
    state_00.wrapT = uVar21;
    state_00.magFilter = uVar20;
    state_00.minFilter = uVar19;
    state_00.wrapS = uVar8;
    state_00.wrapR = uVar6;
    state_00.minLod = (GLfloat)(undefined4)uStack_84;
    state_00.maxLod = (GLfloat)uStack_84._4_4_;
    uStack_90 = uVar7;
    local_8c = uVar8;
    uStack_88 = uVar6;
    setTextureState(gl,this->m_target,state_00);
    GVar23 = local_bc;
    (*gl->bindTexture)(this->m_target,local_bc);
    GVar25 = (*gl->getError)();
    glu::checkError(GVar25,"glBindTexture(m_target, texture2)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                    ,0x44c);
    uVar9 = (this->m_textureState2).wrapS;
    uVar13 = (this->m_textureState2).minFilter;
    uVar14 = (this->m_textureState2).magFilter;
    uVar15 = (this->m_textureState2).wrapT;
    state_01.wrapT = uVar15;
    state_01.magFilter = uVar14;
    state_01.minFilter = uVar13;
    uVar10 = (this->m_textureState2).wrapR;
    uVar11 = (this->m_textureState2).minLod;
    uVar12 = (this->m_textureState2).maxLod;
    state_01.maxLod = (GLfloat)uVar12;
    state_01.minLod = (GLfloat)uVar11;
    state_01.wrapS = uVar9;
    state_01.wrapR = uVar10;
    setTextureState(gl,this->m_target,state_01);
    (*gl->activeTexture)(0x84c0);
    GVar25 = (*gl->getError)();
    glu::checkError(GVar25,"glActiveTexture(GL_TEXTURE0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                    ,0x450);
    (*gl->bindTexture)(this->m_target,GVar22);
    GVar25 = (*gl->getError)();
    glu::checkError(GVar25,"glBindTexture(m_target, texture1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                    ,0x452);
    (*gl->activeTexture)(0x84c1);
    GVar25 = (*gl->getError)();
    glu::checkError(GVar25,"glActiveTexture(GL_TEXTURE1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                    ,0x455);
    (*gl->bindTexture)(this->m_target,GVar23);
    GVar25 = (*gl->getError)();
    glu::checkError(GVar25,"glBindTexture(m_target, texture2)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                    ,0x457);
    render(this);
    pRVar2 = this->m_renderCtx;
    tcu::Surface::getAccess(&local_58,local_a8);
    y_00 = local_b4;
    iVar24 = local_b8;
    glu::readPixels(pRVar2,local_b8,local_b4,&local_58);
    (*gl->bindSampler)(0,0);
    GVar25 = (*gl->getError)();
    glu::checkError(GVar25,"glBindSampler(0, 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                    ,0x45e);
    (*gl->bindSampler)(1,0);
    GVar25 = (*gl->getError)();
    glu::checkError(GVar25,"glBindSampler(1, 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                    ,0x460);
    render(this);
    pRVar2 = this->m_renderCtx;
    tcu::Surface::getAccess(&local_58,local_a0);
    glu::readPixels(pRVar2,iVar24,y_00,&local_58);
    (*gl->activeTexture)(0x84c0);
    GVar25 = (*gl->getError)();
    glu::checkError(GVar25,"glActiveTexture(GL_TEXTURE0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                    ,0x466);
    (*gl->bindTexture)(this->m_target,0);
    GVar25 = (*gl->getError)();
    glu::checkError(GVar25,"glBindTexture(m_target, 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                    ,0x468);
    (*gl->activeTexture)(0x84c1);
    GVar25 = (*gl->getError)();
    glu::checkError(GVar25,"glActiveTexture(GL_TEXTURE1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                    ,0x46b);
    (*gl->bindTexture)(this->m_target,0);
    GVar25 = (*gl->getError)();
    glu::checkError(GVar25,"glBindTexture(m_target, 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                    ,0x46d);
    (*gl->deleteSamplers)(1,&sampler);
    GVar25 = (*gl->getError)();
    glu::checkError(GVar25,"glDeleteSamplers(1, &sampler)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                    ,0x470);
    (*gl->deleteTextures)(1,&texture1);
    GVar25 = (*gl->getError)();
    glu::checkError(GVar25,"glDeleteTextures(1, &texture1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                    ,0x472);
    (*gl->deleteTextures)(1,&texture2);
    GVar25 = (*gl->getError)();
    glu::checkError(GVar25,"glDeleteTextures(1, &texture2)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                    ,0x474);
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"sampler != (GLuint)-1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
             ,0x43c);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void MultiTextureSamplerTest::renderResults (tcu::Surface& textureResult, tcu::Surface& samplerResult, int x, int y)
{
	const glw::Functions&	gl			= m_renderCtx.getFunctions();
	GLuint					texture1	= createTexture(gl, m_target, 0);
	GLuint					texture2	= createTexture(gl, m_target, 1);
	GLuint					sampler		= -1;

	gl.viewport(x, y, VIEWPORT_WIDTH, VIEWPORT_HEIGHT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glViewport(x, y, VIEWPORT_WIDTH, VIEWPORT_HEIGHT)");

	gl.genSamplers(1, &sampler);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenSamplers(1, &sampler)");
	TCU_CHECK(sampler != (GLuint)-1);

	gl.bindSampler(0, sampler);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindSampler(0, sampler)");
	gl.bindSampler(1, sampler);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindSampler(1, sampler)");

	// First set sampler state
	setSamplerState(gl, m_samplerState, sampler);

	// Set texture state
	gl.bindTexture(m_target, texture1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture(m_target, texture1)");
	setTextureState(gl, m_target, m_textureState1);

	gl.bindTexture(m_target, texture2);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture(m_target, texture2)");
	setTextureState(gl, m_target, m_textureState2);

	gl.activeTexture(GL_TEXTURE0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glActiveTexture(GL_TEXTURE0)");
	gl.bindTexture(m_target, texture1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture(m_target, texture1)");

	gl.activeTexture(GL_TEXTURE1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glActiveTexture(GL_TEXTURE1)");
	gl.bindTexture(m_target, texture2);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture(m_target, texture2)");

	// Render using sampler
	render();
	glu::readPixels(m_renderCtx, x, y, samplerResult.getAccess());

	gl.bindSampler(0, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindSampler(0, 0)");
	gl.bindSampler(1, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindSampler(1, 0)");

	render();
	glu::readPixels(m_renderCtx, x, y, textureResult.getAccess());

	gl.activeTexture(GL_TEXTURE0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glActiveTexture(GL_TEXTURE0)");
	gl.bindTexture(m_target, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture(m_target, 0)");

	gl.activeTexture(GL_TEXTURE1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glActiveTexture(GL_TEXTURE1)");
	gl.bindTexture(m_target, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture(m_target, 0)");

	gl.deleteSamplers(1, &sampler);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteSamplers(1, &sampler)");
	gl.deleteTextures(1, &texture1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteTextures(1, &texture1)");
	gl.deleteTextures(1, &texture2);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteTextures(1, &texture2)");
}